

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void absl::lts_20250127::synchronization_internal::Sort
               (Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>
                *nodes,Vec<int> *delta)

{
  int *__first;
  int *__last;
  ByRank cmp;
  Vec<int> *delta_local;
  Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*> *nodes_local;
  
  __first = anon_unknown_0::Vec<int>::begin(delta);
  __last = anon_unknown_0::Vec<int>::end(delta);
  std::
  sort<int*,absl::lts_20250127::synchronization_internal::Sort(absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node*>const&,absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<int>*)::ByRank>
            (__first,__last,(ByRank)nodes);
  return;
}

Assistant:

static void Sort(const Vec<Node*>& nodes, Vec<int32_t>* delta) {
  struct ByRank {
    const Vec<Node*>* nodes;
    bool operator()(int32_t a, int32_t b) const {
      return (*nodes)[static_cast<uint32_t>(a)]->rank <
             (*nodes)[static_cast<uint32_t>(b)]->rank;
    }
  };
  ByRank cmp;
  cmp.nodes = &nodes;
  std::sort(delta->begin(), delta->end(), cmp);
}